

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleVector.h
# Opt level: O0

void __thiscall SimpleVector<ValuePair>::resizeBuffer(SimpleVector<ValuePair> *this,long n)

{
  ValuePair *pVVar1;
  RefCountedStorage *pRVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  long *plVar5;
  ValuePair *this_00;
  ValuePair *pVVar6;
  ulong uVar7;
  unsigned_long local_98;
  ValuePair *local_78;
  ValuePair *end;
  ValuePair *dest;
  ValuePair *src;
  ValuePair *newbuf;
  long n_local;
  SimpleVector<ValuePair> *this_local;
  
  if (n != this->mBufItems) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = n;
    uVar4 = SUB168(auVar3 * ZEXT816(0x20),0);
    uVar7 = uVar4 + 8;
    if (SUB168(auVar3 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar7 = 0xffffffffffffffff;
    }
    plVar5 = (long *)operator_new__(uVar7);
    *plVar5 = n;
    pVVar6 = (ValuePair *)(plVar5 + 1);
    if (n != 0) {
      local_78 = pVVar6;
      do {
        MiniScript::Value::RecursiveEqual::ValuePair::ValuePair(local_78);
        local_78 = local_78 + 1;
      } while (local_78 != pVVar6 + n);
    }
    if (this->mBuf != (ValuePair *)0x0) {
      pVVar1 = this->mBuf;
      local_98 = n;
      if ((long)this->mQtyItems < n) {
        local_98 = this->mQtyItems;
      }
      end = pVVar6;
      dest = this->mBuf;
      while (dest < pVVar1 + local_98) {
        MiniScript::Value::RecursiveEqual::ValuePair::operator=(end,dest);
        end = end + 1;
        dest = dest + 1;
      }
      pVVar1 = this->mBuf;
      if (pVVar1 != (ValuePair *)0x0) {
        pRVar2 = pVVar1[-1].b.data.ref;
        this_00 = pVVar1 + (long)pRVar2;
        while (pVVar1 != this_00) {
          this_00 = this_00 + -1;
          MiniScript::Value::RecursiveEqual::ValuePair::~ValuePair(this_00);
        }
        operator_delete__(&pVVar1[-1].b.data,(long)pRVar2 * 0x20 + 8);
      }
    }
    this->mBuf = pVVar6;
    this->mBufItems = n;
    if (this->mBufItems < this->mQtyItems) {
      this->mQtyItems = this->mBufItems;
    }
  }
  return;
}

Assistant:

inline void SimpleVector<T>::resizeBuffer(long n)
{
	if (n == (long)mBufItems) return;
	T *newbuf = new T[n];
//	if (!newbuf) throw memFullErr;	// (not needed, as new now throws if it fails)
	if (mBuf) {
		T* src = mBuf;
		T* dest = newbuf;
		T* end = &mBuf[((long)mQtyItems < n) ? mQtyItems : n];	// the smaller value
		while (src < end) {
			*dest++ = *src++;
		}
		delete[] mBuf;
	}
	mBuf = newbuf;
	mBufItems = n;
	if (mQtyItems > mBufItems) mQtyItems = mBufItems;
 }